

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# para_ctrl.c
# Opt level: O3

void Init_BodyPosturePara(void)

{
  sRobot_BodyPosturePara.X = 0.0;
  sRobot_BodyPosturePara.Y = 0.0;
  sRobot_BodyPosturePara.Z = 480.0;
  sRobot_BodyPosturePara.Roll = 0.0;
  sRobot_BodyPosturePara.Pitch = 0.0;
  sRobot_BodyPosturePara.Yaw = 0.0;
  return;
}

Assistant:

void Init_BodyPosturePara(void)
{
#ifndef __SERVO_ROBOT
	sRobot_BodyPosturePara.X = 0;
	sRobot_BodyPosturePara.Y = 0;
	sRobot_BodyPosturePara.Z = 480;
	sRobot_BodyPosturePara.Roll = 0;
	sRobot_BodyPosturePara.Pitch = 0;
	sRobot_BodyPosturePara.Yaw = 0;

#else
	sRobot_BodyPosturePara.X = 0;
	sRobot_BodyPosturePara.Y = 0;
	sRobot_BodyPosturePara.Z = 180;
	sRobot_BodyPosturePara.Roll = 0;
	sRobot_BodyPosturePara.Pitch = 0;
	sRobot_BodyPosturePara.Yaw = 0;

#endif
}